

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
booster::locale::basic_format<char>::format_output
          (basic_format<char> *this,stream_type *out,string_type *sformat)

{
  byte bVar1;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  code *pcVar5;
  pointer pfVar6;
  ulong uVar7;
  long lVar8;
  void *pvVar9;
  char cVar10;
  ulong uVar11;
  format_guard guard;
  string key;
  format_parser fmt;
  string svalue;
  string_type value;
  format_guard local_c8;
  ulong local_b8;
  string local_b0;
  format_parser local_90 [16];
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  formattible_type *local_40;
  basic_format<char> *local_38;
  
  pcVar2 = (sformat->_M_dataplus)._M_p;
  local_b8 = sformat->_M_string_length;
  local_40 = this->parameters_;
  uVar7 = 0;
  local_38 = this;
  do {
    while( true ) {
      cVar10 = pcVar2[uVar7];
      if (cVar10 != '{') break;
      uVar11 = uVar7 + 1;
      if ((uVar11 < local_b8) && (pcVar2[uVar11] == '{')) {
        local_b0._M_dataplus._M_p._0_1_ = 0x7b;
LAB_0011ae97:
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_b0,1);
        uVar7 = uVar7 + 2;
      }
      else {
        booster::locale::details::format_parser::format_parser
                  (local_90,(ios_base *)(out + *(long *)(*(long *)out + -0x18)),out,imbue_locale);
        local_c8.restored_ = false;
        local_c8.fmt_ = local_90;
        do {
          uVar7 = uVar11;
          if (local_b8 <= uVar11) break;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          local_b0._M_string_length = 0;
          local_b0.field_2._M_local_buf[0] = '\0';
          local_80 = local_70;
          local_78 = 0;
          local_70[0] = 0;
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          local_60._M_string_length = 0;
          local_60.field_2._M_local_buf[0] = '\0';
          while( true ) {
            bVar1 = pcVar2[uVar11];
            if ((((ulong)bVar1 < 0x3e) && ((0x2000100000000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
               || (bVar1 == 0x7d)) break;
            std::__cxx11::string::push_back((char)&local_b0);
            uVar11 = uVar11 + 1;
          }
          bVar3 = true;
          if (pcVar2[uVar11] == '=') {
            if (pcVar2[uVar11 + 1] == '\'') {
              uVar11 = uVar11 + 2;
LAB_0011af71:
              cVar10 = (char)&local_60;
              if (pcVar2[uVar11] != '\'') {
                if (pcVar2[uVar11] == '\0') goto LAB_0011afd8;
                lVar8 = 1;
                std::__cxx11::string::push_back(cVar10);
LAB_0011afab:
                uVar11 = uVar11 + lVar8;
                goto LAB_0011af71;
              }
              if (pcVar2[uVar11 + 1] == '\'') {
                lVar8 = 2;
                std::__cxx11::string::push_back(cVar10);
                goto LAB_0011afab;
              }
              uVar11 = uVar11 + 1;
LAB_0011afd8:
              bVar3 = false;
            }
            else {
              while( true ) {
                uVar11 = uVar11 + 1;
                cVar10 = pcVar2[uVar11];
                if (((cVar10 == '\0') || (cVar10 == ',')) || (cVar10 == '}')) break;
                std::__cxx11::string::push_back((char)&local_80);
              }
            }
          }
          if (bVar3) {
            booster::locale::details::format_parser::set_one_flag
                      ((string *)local_90,(string *)&local_b0);
          }
          else {
            details::format_parser::set_flag_with_str<char>(local_90,&local_b0,&local_60);
          }
          if (pcVar2[uVar11] == '}') {
            uVar4 = booster::locale::details::format_parser::get_position();
            if (uVar4 < local_38->parameters_count_) {
              pfVar6 = (local_38->ext_params_).
                       super__Vector_base<booster::locale::details::formattible<char>,_std::allocator<booster::locale::details::formattible<char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (uVar4 - 8);
              if (uVar4 < 8) {
                pfVar6 = local_40 + uVar4;
              }
              pvVar9 = pfVar6->pointer_;
              pcVar5 = pfVar6->writer_;
            }
            else {
              pcVar5 = details::formattible<char>::void_write;
              pvVar9 = (void *)0x0;
            }
            (*pcVar5)(out,pvVar9);
            if (local_c8.restored_ == false) {
              booster::locale::details::format_parser::restore();
              local_c8.restored_ = true;
            }
            uVar11 = uVar11 + 1;
LAB_0011b0a2:
            bVar3 = false;
          }
          else {
            if (pcVar2[uVar11] != ',') {
              if (local_c8.restored_ == false) {
                booster::locale::details::format_parser::restore();
                local_c8.restored_ = true;
              }
              goto LAB_0011b0a2;
            }
            uVar11 = uVar11 + 1;
            bVar3 = true;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p);
          }
          if (local_80 != local_70) {
            operator_delete(local_80);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          uVar7 = uVar11;
        } while (bVar3);
        format_guard::~format_guard(&local_c8);
        booster::locale::details::format_parser::~format_parser(local_90);
      }
    }
    if (cVar10 == '}') {
      if (pcVar2[uVar7 + 1] == '}') {
        local_b0._M_dataplus._M_p._0_1_ = 0x7d;
        goto LAB_0011ae97;
      }
    }
    else if (cVar10 == '\0') {
      return;
    }
    local_b0._M_dataplus._M_p._0_1_ = cVar10;
    std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_b0,1);
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void format_output(stream_type &out,string_type const &sformat) const
            {
                char_type obrk='{';
                char_type cbrk='}';
                char_type eq='=';
                char_type comma=',';
                char_type quote='\'';

                size_t pos = 0;
                size_t size=sformat.size();
                CharType const *format=sformat.c_str();
                while(format[pos]!=0) {
                    if(format[pos] != obrk) {
                        if(format[pos]==cbrk && format[pos+1]==cbrk) {
                            out << cbrk;
                            pos+=2;
                        }
                        else {
                            out<<format[pos];
                            pos++;
                        }
                        continue;
                    }

                    if(pos+1 < size && format[pos+1]==obrk) {
                        out << obrk;
                        pos+=2;
                        continue;
                    }
                    pos++;
                  
                    details::format_parser fmt(out,static_cast<void *>(&out),&basic_format::imbue_locale);

                    format_guard guard(fmt);

                    while(pos < size) { 
                        std::string key;
                        std::string svalue;
                        string_type value;
                        bool use_svalue = true;
                        for(;format[pos];pos++) {
                            char_type c=format[pos];
                            if(c==comma || c==eq || c==cbrk)
                                break;
                            else {
                                key+=static_cast<char>(c);
                            }
                        }

                        if(format[pos]==eq) {
                            pos++;
                            if(format[pos]==quote) {
                                pos++;
                                use_svalue = false;
                                while(format[pos]) {
                                    if(format[pos]==quote) {
                                        if(format[pos+1]==quote) {
                                            value+=quote;
                                            pos+=2;
                                        }
                                        else {
                                            pos++;
                                            break;
                                        }
                                    }
                                    else {
                                        value+=format[pos];
                                        pos++;
                                    }
                                }
                            }
                            else {
                                char_type c;
                                while((c=format[pos])!=0 && c!=comma && c!=cbrk) {
                                    svalue+=static_cast<char>(c);
                                    pos++;
                                }
                            }
                        }

                        if(use_svalue) {
                            fmt.set_one_flag(key,svalue);
                        }
                        else 
                            fmt.set_flag_with_str(key,value);
                        
                        if(format[pos]==comma) {
                            pos++;
                            continue;
                        }
                        else if(format[pos]==cbrk)  {
                            unsigned position = fmt.get_position();
                            out << get(position);
                            guard.restore();
                            pos++;
                            break;
                        }
                        else {                        
                            guard.restore();
                            break;
                        }
                    }
                }
            }